

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  PrimitiveHandle *this_00;
  Float tMax;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  SampledWavelengths *pSVar10;
  bool bVar11;
  int iVar12;
  DebugMLTSampler *this_01;
  undefined1 auVar15 [16];
  long in_FS_OFFSET;
  undefined1 in_ZmmResult [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  float fVar22;
  float fVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar24;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar39 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar38 [64];
  undefined8 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [56];
  undefined1 auVar45 [56];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  SampledSpectrum SVar56;
  anon_class_8_1_5ef94505 samp;
  Ray r;
  BSDF bsdf;
  Tuple3<pbrt::Vector3,_float> local_398;
  DispatchSplit<7> local_389;
  undefined1 local_388 [16];
  float local_36c;
  undefined1 local_368 [16];
  SampledWavelengths *local_350;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_348;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined8 *local_2f0;
  uchar *local_2e8;
  ScratchBuffer *local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  anon_struct_8_0_00000001_for___align local_2b8;
  float fStack_2b0;
  float local_2ac;
  float fStack_2a8;
  ulong uStack_2a4;
  MediumHandle local_298;
  undefined1 local_288 [152];
  Tuple3<pbrt::Vector3,_float> aTStack_1f0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_1d8;
  int iStack_1cc;
  MaterialHandle local_1c8;
  LightHandle LStack_1c0;
  undefined8 local_1b8 [5];
  Float local_190;
  char local_188;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_178;
  ulong local_78;
  BSDF local_68;
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  undefined1 auVar37 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 auVar43 [64];
  
  local_188 = '\0';
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_2f0 = local_1b8;
  local_2e8 = local_178.__data + 0xd0;
  local_350 = lambda;
  local_2e0 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_178._64_8_ = 0;
      local_178._136_8_ = 0;
      local_178._144_8_ = 0;
      local_178._152_8_ = 0;
      local_178._160_8_ = 0;
      local_178._168_8_ = 0;
      local_178._176_8_ = 0;
      local_178._184_8_ = 0;
      local_178._80_48_ = (undefined1  [48])0x0;
      local_78 = 0;
      local_178._0_64_ = in_ZmmResult;
      local_178._72_8_ = local_178._136_8_;
      local_178._128_8_ = local_178._64_8_;
      local_178._192_64_ = in_ZmmResult;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_178.__align,this_00,&ray->super_Ray,
                 INFINITY);
    }
    if (local_188 == '\x01') {
      local_188 = '\0';
    }
    if ((char)local_78 == '\x01') {
      local_288._0_8_ = local_178.__align;
      local_288._8_8_ = local_178._8_8_;
      local_288._16_8_ = local_178._16_8_;
      local_288._24_8_ = local_178._24_8_;
      local_288._32_8_ = local_178._32_8_;
      local_288._40_8_ = local_178._40_8_;
      local_288._48_8_ = local_178._48_8_;
      local_288._56_8_ = local_178._56_8_;
      local_288._64_8_ = local_178._64_8_;
      local_288._72_8_ = local_178._72_8_;
      in_ZmmResult._48_8_ = local_178._128_8_;
      in_ZmmResult._0_48_ = local_178._80_48_;
      in_ZmmResult._56_8_ = local_178._136_8_;
      local_288._144_8_ = local_178._144_8_;
      aTStack_1f0[0].x = (float)local_178._152_4_;
      aTStack_1f0[0].y = (float)local_178._156_4_;
      aTStack_1f0[0].z = (float)local_178._160_4_;
      aTStack_1f0[1].x = (float)local_178._164_4_;
      aTStack_1f0[1].y = (float)local_178._168_4_;
      aTStack_1f0[1].z = (float)local_178._172_4_;
      TStack_1d8.x = (float)local_178._176_4_;
      TStack_1d8.y = (float)local_178._180_4_;
      TStack_1d8.z = (float)local_178._184_4_;
      iStack_1cc = local_178._188_4_;
      local_1c8.
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
               )(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                 )local_178._192_8_;
      LStack_1c0.
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 )local_178._200_8_;
      local_2f0[4] = *(undefined8 *)(local_2e8 + 0x20);
      uVar40 = *(undefined8 *)(local_2e8 + 8);
      uVar24 = *(undefined8 *)(local_2e8 + 0x10);
      uVar9 = *(undefined8 *)(local_2e8 + 0x18);
      *local_2f0 = *(undefined8 *)local_2e8;
      local_2f0[1] = uVar40;
      local_2f0[2] = uVar24;
      local_2f0[3] = uVar9;
      local_190 = (Float)local_178._248_4_;
      local_188 = '\x01';
      local_78 = local_78 & 0xffffffffffffff00;
      local_288._80_64_ = in_ZmmResult;
    }
    if ((char)local_78 == '\x01') {
      local_78 = local_78 & 0xffffffffffffff00;
    }
    uVar40 = 0;
    if (local_188 != '\x01') {
      uVar24 = 0;
      goto LAB_003ddbb7;
    }
    local_340.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_348.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_68,(SurfaceInteraction *)local_288,ray,local_350,(CameraHandle *)&local_340,
               local_2e0,(SamplerHandle *)&local_348);
    if (((ulong)local_68.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) == 0) {
      if (local_188 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      iVar12 = 2;
      SurfaceInteraction::SkipIntersection((SurfaceInteraction *)local_288,ray,local_190);
    }
    else {
      fVar22 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_318._8_8_ = 0;
      local_318._0_8_ = local_288._40_8_;
      auVar15 = vmovshdup_avx(local_318);
      auVar13 = ZEXT416((uint)((float)local_288._48_4_ * -fVar22));
      auVar15 = vfnmadd132ss_fma(auVar15,auVar13,
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .y));
      local_308 = ZEXT416((uint)local_288._48_4_);
      auVar13 = vfnmsub213ss_fma(ZEXT416((uint)fVar22),local_308,auVar13);
      auVar15 = vfnmadd132ss_fma(local_318,ZEXT416((uint)(auVar15._0_4_ + auVar13._0_4_)),
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .x));
      local_328._0_4_ = auVar15._0_4_;
      if (auVar15._0_4_ < 0.0) {
        local_318._0_8_ = local_288._40_8_ ^ 0x8000000080000000;
        local_318._8_4_ = 0x80000000;
        local_318._12_4_ = 0x80000000;
      }
      auVar13._0_4_ = local_288._84_4_ * local_288._84_4_;
      auVar13._4_4_ = local_288._88_4_ * local_288._88_4_;
      auVar13._8_8_ = 0;
      auVar15 = vmovshdup_avx(auVar13);
      fVar22 = (float)local_288._80_4_ * (float)local_288._80_4_ + auVar13._0_4_ + auVar15._0_4_;
      if (fVar22 < 0.0) {
        sqrtf(fVar22);
      }
      local_398.x = 0.0;
      local_398.y = 0.0;
      local_398.z = 0.0;
      uVar1 = (sampler->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      this_01 = (DebugMLTSampler *)(uVar1 & 0xffffffffffff);
      uVar6 = (ushort)(uVar1 >> 0x30);
      if (uVar1 >> 0x30 < 5) {
        if (uVar6 < 3) {
          if (uVar6 == 2) {
            auVar28._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_01);
            auVar28._8_56_ = extraout_var_01;
            auVar15 = auVar28._0_16_;
          }
          else {
            auVar32._0_8_ = RandomSampler::Get2D((RandomSampler *)this_01);
            auVar32._8_56_ = extraout_var_05;
            auVar15 = auVar32._0_16_;
          }
        }
        else if (uVar6 == 3) {
          auVar30._0_8_ = HaltonSampler::Get2D((HaltonSampler *)this_01);
          auVar30._8_56_ = extraout_var_03;
          auVar15 = auVar30._0_16_;
        }
        else {
          auVar34._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
          auVar34._8_56_ = extraout_var_07;
          auVar15 = auVar34._0_16_;
        }
      }
      else if (uVar6 < 7) {
        if (uVar6 == 6) {
          auVar29._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)this_01);
          auVar29._8_56_ = extraout_var_02;
          auVar15 = auVar29._0_16_;
        }
        else {
          auVar33._0_8_ = SobolSampler::Get2D((SobolSampler *)this_01);
          auVar33._8_56_ = extraout_var_06;
          auVar15 = auVar33._0_16_;
        }
      }
      else if (uVar1 >> 0x30 == 8) {
        auVar35._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
        auVar35._8_56_ = extraout_var_08;
        auVar15 = auVar35._0_16_;
      }
      else if (uVar6 == 7) {
        auVar31._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
        auVar31._8_56_ = extraout_var_04;
        auVar15 = auVar31._0_16_;
      }
      else {
        local_388._0_4_ = DebugMLTSampler::Get1D(this_01);
        local_388._4_4_ = extraout_XMM0_Db;
        local_388._8_4_ = extraout_XMM0_Dc;
        local_388._12_4_ = extraout_XMM0_Dd;
        auVar38._0_4_ = DebugMLTSampler::Get1D(this_01);
        auVar38._4_60_ = extraout_var_00;
        auVar15 = vinsertps_avx(local_388,auVar38._0_16_,0x10);
      }
      fVar22 = auVar15._0_4_;
      if (this->cosSample == true) {
        auVar14._0_4_ = fVar22 + fVar22;
        auVar14._4_4_ = auVar15._4_4_ + auVar15._4_4_;
        auVar14._8_4_ = auVar15._8_4_ + auVar15._8_4_;
        auVar14._12_4_ = auVar15._12_4_ + auVar15._12_4_;
        auVar15._8_4_ = 0xbf800000;
        auVar15._0_8_ = 0xbf800000bf800000;
        auVar15._12_4_ = 0xbf800000;
        auVar17._16_48_ = in_ZmmResult._16_48_;
        auVar13 = vaddps_avx512vl(auVar14,auVar15);
        auVar15 = vmovshdup_avx(auVar13);
        auVar7 = ZEXT812(0);
        fVar23 = auVar13._0_4_;
        fVar22 = auVar15._0_4_;
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
LAB_003dd77c:
          auVar2._8_4_ = 0x7fffffff;
          auVar2._0_8_ = 0x7fffffff7fffffff;
          auVar2._12_4_ = 0x7fffffff;
          auVar14 = vandps_avx512vl(auVar13,auVar2);
          auVar41 = vshufps_avx(auVar14,auVar14,0xf5);
          bVar11 = auVar41._0_4_ < auVar14._0_4_;
          auVar25._0_4_ = fVar23 / fVar22;
          auVar25._4_12_ = auVar13._4_12_;
          auVar13 = vfmadd132ss_fma(auVar25,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
          auVar17._0_16_ = auVar13;
          auVar16._4_60_ = auVar17._4_60_;
          auVar16._0_4_ =
               (float)((uint)bVar11 * (int)((fVar22 / fVar23) * 0.7853982) +
                      (uint)!bVar11 * auVar13._0_4_);
          local_338 = auVar16._0_16_;
          auVar19._16_48_ = auVar17._16_48_;
          auVar19._0_16_ = auVar15;
          auVar18._4_60_ = auVar19._4_60_;
          auVar18._0_4_ = (uint)bVar11 * (int)fVar23 + (uint)!bVar11 * (int)fVar22;
          local_388 = auVar18._0_16_;
          fVar22 = cosf(auVar16._0_4_);
          local_368._0_4_ = fVar22;
          fVar22 = sinf((float)local_338._0_4_);
          auVar7 = ZEXT812(0) << 0x20;
          auVar41 = vinsertps_avx(ZEXT416((uint)(local_388._0_4_ * (float)local_368._0_4_)),
                                  ZEXT416((uint)(local_388._0_4_ * fVar22)),0x10);
        }
        else {
          auVar41 = ZEXT816(0) << 0x40;
          if ((fVar22 != 0.0) || (NAN(fVar22))) goto LAB_003dd77c;
        }
        auVar8._12_4_ = 0;
        auVar8._0_12_ = auVar7;
        auVar13 = vfnmadd213ss_fma(auVar41,auVar41,ZEXT416(0x3f800000));
        auVar15 = vmovshdup_avx(auVar41);
        auVar15 = vfnmadd213ss_fma(auVar15,auVar15,auVar13);
        auVar15 = vmaxss_avx(auVar15,auVar8 << 0x20);
        if (auVar15._0_4_ < 0.0) {
          local_388 = auVar41;
          auVar36._0_4_ = sqrtf(auVar15._0_4_);
          auVar36._4_60_ = extraout_var;
          auVar15 = auVar36._0_16_;
          auVar41 = local_388;
        }
        else {
          auVar15 = vsqrtss_avx(auVar15,auVar15);
        }
        local_398._0_8_ = vmovlps_avx(auVar41);
        local_398.z = auVar15._0_4_;
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        in_ZmmResult._0_16_ = vandps_avx512vl(auVar15,auVar3);
        in_ZmmResult._16_48_ = auVar17._16_48_;
        fVar22 = in_ZmmResult._0_4_ * 0.31830987;
      }
      else {
        auVar41._0_12_ = ZEXT812(0);
        auVar41._12_4_ = 0;
        auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar22 * fVar22)),auVar41);
        local_368 = auVar15;
        if (auVar13._0_4_ < 0.0) {
          fVar22 = sqrtf(auVar13._0_4_);
        }
        else {
          auVar15 = vsqrtss_avx(auVar13,auVar13);
          fVar22 = auVar15._0_4_;
        }
        local_388._0_4_ = fVar22;
        auVar15 = vmovshdup_avx(local_368);
        local_36c = auVar15._0_4_ * 6.2831855;
        fVar22 = cosf(local_36c);
        local_338 = ZEXT416((uint)(fVar22 * (float)local_388._0_4_));
        fVar22 = sinf(local_36c);
        auVar15 = vinsertps_avx(local_338,ZEXT416((uint)(fVar22 * (float)local_388._0_4_)),0x10);
        local_398._0_8_ = vmovlps_avx(auVar15);
        local_398.z = (float)local_368._0_4_;
        fVar22 = 0.15915494;
      }
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        local_388._0_4_ = fVar22;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar21._16_48_ = in_ZmmResult._16_48_;
        auVar15 = vxorps_avx512vl(local_308,auVar4);
        uVar40 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_328._0_4_),0xe);
        bVar11 = (bool)((byte)uVar40 & 1);
        auVar21._0_16_ = local_308;
        auVar20._4_60_ = auVar21._4_60_;
        auVar20._0_4_ = (float)((uint)bVar11 * auVar15._0_4_ + (uint)!bVar11 * local_308._0_4_);
        local_308 = auVar20._0_16_;
        auVar46._8_4_ = 0x80000000;
        auVar46._0_8_ = 0x8000000080000000;
        auVar46._12_4_ = 0x80000000;
        auVar5._8_4_ = 0x3f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar5._12_4_ = 0x3f800000;
        in_ZmmResult._0_16_ = vpternlogd_avx512vl(auVar46,local_308,auVar5,0xea);
        in_ZmmResult._16_48_ = auVar21._16_48_;
        fVar23 = in_ZmmResult._0_4_;
        auVar42._0_4_ = -1.0 / (auVar20._0_4_ + fVar23);
        local_328 = vmovshdup_avx(local_318);
        fVar52 = local_318._0_4_;
        auVar48._8_8_ = 0;
        auVar48._0_4_ = local_398.x;
        auVar48._4_4_ = local_398.y;
        fVar47 = local_398.x;
        auVar49._0_4_ = fVar52 * fVar47;
        fVar53 = local_318._4_4_;
        auVar49._4_4_ = fVar53 * local_398.y;
        fVar54 = local_318._8_4_;
        auVar49._8_4_ = fVar54 * 0.0;
        fVar55 = local_318._12_4_;
        auVar49._12_4_ = fVar55 * 0.0;
        auVar13 = vmovshdup_avx(auVar49);
        fVar22 = fVar52 * local_328._0_4_ * auVar42._0_4_;
        auVar50._0_4_ = fVar52 * fVar52 * fVar23;
        auVar50._4_4_ = fVar53 * 0.0;
        auVar50._8_4_ = fVar54 * 0.0;
        auVar50._12_4_ = fVar55 * 0.0;
        auVar42._4_4_ = auVar42._0_4_;
        auVar42._8_4_ = auVar42._0_4_;
        auVar42._12_4_ = auVar42._0_4_;
        auVar51._8_4_ = 0x3f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._12_4_ = 0x3f800000;
        auVar15 = vunpcklps_avx(auVar51,in_ZmmResult._0_16_);
        auVar14 = vfmadd231ps_fma(auVar15,auVar50,auVar42);
        auVar15 = vinsertps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)(fVar23 * fVar22)),0x1c);
        auVar41 = vshufps_avx(auVar48,auVar48,0xe1);
        auVar26._0_4_ =
             fVar52 * local_398.z + auVar15._0_4_ * auVar41._0_4_ + auVar14._0_4_ * fVar47;
        auVar26._4_4_ =
             fVar53 * local_398.z + auVar15._4_4_ * auVar41._4_4_ + auVar14._4_4_ * local_398.y;
        auVar26._8_4_ = fVar54 * local_398.z + auVar15._8_4_ * auVar41._8_4_ + auVar14._8_4_ * 0.0;
        auVar26._12_4_ =
             fVar55 * local_398.z + auVar15._12_4_ * auVar41._12_4_ + auVar14._12_4_ * 0.0;
        local_398._0_8_ = vmovlps_avx(auVar26);
        local_398.z = auVar20._0_4_ * local_398.z + (fVar52 * -fVar23 * fVar47 - auVar13._0_4_);
        Interaction::SpawnRay
                  ((RayDifferential *)&local_178.__align,(Interaction *)local_288,
                   (Vector3f *)&local_398);
        auVar39 = local_178._8_56_;
        auVar17._16_48_ = in_ZmmResult._16_48_;
        auVar44 = ZEXT856((ulong)local_178._20_8_);
        auVar45 = ZEXT856((ulong)local_178._20_8_);
        fStack_2a8 = local_178._16_4_;
        uStack_2a4 = local_178._20_8_;
        local_2b8 = local_178.__align;
        fStack_2b0 = local_178._8_4_;
        local_2ac = local_178._12_4_;
        local_298.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )local_178._32_8_;
        tMax = this->maxDist;
        *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
        local_178._8_56_ = auVar39;
        if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
             super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
             .bits & 0xffffffffffff) != 0) {
          auVar45 = auVar44;
          bVar11 = PrimitiveHandle::IntersectP(this_00,(Ray *)&local_2b8,tMax);
          auVar17._16_48_ = in_ZmmResult._16_48_;
          iVar12 = 0;
          if (bVar11) goto LAB_003ddb61;
        }
        pSVar10 = local_350;
        auVar39 = (undefined1  [56])0x0;
        local_368 = ZEXT416((uint)this->illumScale);
        local_178.__align =
             (anon_struct_8_0_00000001_for___align)
             (this->illuminant).
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             .bits;
        SVar56 = DispatchSplit<7>::operator()
                           (&local_389,local_350,&local_178,(ulong)local_178.__align >> 0x30);
        auVar43._0_8_ = SVar56.values.values._8_8_;
        auVar43._8_56_ = auVar45;
        auVar37._0_8_ = SVar56.values.values._0_8_;
        auVar37._8_56_ = auVar39;
        auVar15 = vmovlhps_avx(auVar37._0_16_,auVar43._0_16_);
        auVar41 = ZEXT416((uint)(local_308._0_4_ * local_398.z));
        auVar13 = vfmadd132ss_fma(local_328,auVar41,ZEXT416((uint)local_398.y));
        auVar41 = vfmsub213ss_fma(ZEXT416((uint)local_398.z),local_308,auVar41);
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar41._0_4_)),local_318,
                                  ZEXT416((uint)local_398.x));
        fVar22 = auVar13._0_4_ / ((float)local_388._0_4_ * 3.1415927);
        auVar27._0_4_ = fVar22 * (float)local_368._0_4_ * auVar15._0_4_;
        auVar27._4_4_ = fVar22 * (float)local_368._0_4_ * auVar15._4_4_;
        auVar27._8_4_ = fVar22 * (float)local_368._0_4_ * auVar15._8_4_;
        auVar27._12_4_ = fVar22 * (float)local_368._0_4_ * auVar15._12_4_;
        auVar15 = *(undefined1 (*) [16])(pSVar10->pdf).values;
        uVar1 = vcmpps_avx512vl(auVar15,_DAT_00453010,4);
        auVar15 = vdivps_avx512vl(auVar27,auVar15);
        local_2d8._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar15._4_4_;
        local_2d8._0_4_ = (uint)((byte)uVar1 & 1) * auVar15._0_4_;
        local_2d8._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar15._8_4_;
        local_2d8._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar15._12_4_;
        in_ZmmResult._16_48_ = auVar17._16_48_;
        in_ZmmResult._0_16_ = local_2d8;
        local_2c8 = vshufpd_avx(local_2d8,local_2d8,1);
        iVar12 = 1;
      }
      else {
        iVar12 = 1;
        local_2d8 = ZEXT416(0) << 0x20;
        local_2c8 = local_2d8;
      }
    }
LAB_003ddb61:
  } while (iVar12 == 2);
  uVar24 = 0;
  uVar40 = 0;
  if (iVar12 != 0) {
    uVar24 = local_2d8._0_8_;
    uVar40 = local_2c8._0_8_;
  }
LAB_003ddbb7:
  SVar56.values.values[2] = (float)(int)uVar40;
  SVar56.values.values[3] = (float)(int)((ulong)uVar40 >> 0x20);
  SVar56.values.values[0] = (float)(int)uVar24;
  SVar56.values.values[1] = (float)(int)((ulong)uVar24 >> 0x20);
  return (SampledSpectrum)SVar56.values.values;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist)) {
            SampledSpectrum L = illumScale * illuminant.Sample(lambda) *
                                SampledSpectrum(Dot(wi, n) / (Pi * pdf));
            return SafeDiv(L, lambda.PDF());
        }
    }
    return SampledSpectrum(0.);
}